

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::accumulateScaleFactors
          (BeagleCPUImpl<float,_1,_0> *this,int *scalingIndices,int count,int cumulativeScalingIndex
          )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  short **ppsVar5;
  int *piVar6;
  short *psVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  float fVar28;
  double dVar29;
  undefined1 auVar20 [16];
  
  if ((this->kFlags & 0x80) == 0) {
    if (0 < count) {
      pfVar3 = this->gScaleBuffers[cumulativeScalingIndex];
      uVar19 = 0;
      do {
        if (0 < this->kPatternCount) {
          pfVar4 = this->gScaleBuffers[scalingIndices[uVar19]];
          lVar17 = 0;
          do {
            if ((this->kFlags & 0x400) == 0) {
              dVar29 = log((double)pfVar4[lVar17]);
              fVar28 = (float)(dVar29 + (double)pfVar3[lVar17]);
            }
            else {
              fVar28 = pfVar4[lVar17] + pfVar3[lVar17];
            }
            pfVar3[lVar17] = fVar28;
            lVar17 = lVar17 + 1;
          } while (lVar17 < this->kPatternCount);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != (uint)count);
    }
  }
  else {
    pfVar3 = *this->gScaleBuffers;
    iVar1 = this->kPatternCount;
    if (0 < (long)iVar1) {
      memset(pfVar3,0,(long)iVar1 * 4);
    }
    if (0 < count) {
      iVar2 = this->kTipCount;
      ppsVar5 = this->gAutoScaleBuffers;
      piVar6 = this->gActiveScalingFactors;
      auVar23 = vpbroadcastq_avx512f();
      uVar19 = 0;
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar25 = vbroadcastsd_avx512f(ZEXT816(0x3fe62e42fefa39ef));
      do {
        lVar17 = (long)scalingIndices[uVar19] - (long)iVar2;
        if ((piVar6[lVar17] != 0) && (0 < iVar1)) {
          psVar7 = ppsVar5[lVar17];
          uVar18 = 0;
          do {
            auVar26 = vpbroadcastq_avx512f();
            auVar26 = vporq_avx512f(auVar26,auVar24);
            uVar16 = vpcmpuq_avx512f(auVar26,auVar23,2);
            auVar20 = vmovdqu16_avx512vl(*(undefined1 (*) [16])(psVar7 + uVar18));
            bVar8 = (byte)uVar16;
            auVar21._2_2_ = (ushort)((byte)(uVar16 >> 1) & 1) * auVar20._2_2_;
            auVar21._0_2_ = (ushort)(bVar8 & 1) * auVar20._0_2_;
            auVar21._4_2_ = (ushort)((byte)(uVar16 >> 2) & 1) * auVar20._4_2_;
            auVar21._6_2_ = (ushort)((byte)(uVar16 >> 3) & 1) * auVar20._6_2_;
            auVar21._8_2_ = (ushort)((byte)(uVar16 >> 4) & 1) * auVar20._8_2_;
            auVar21._10_2_ = (ushort)((byte)(uVar16 >> 5) & 1) * auVar20._10_2_;
            auVar21._12_2_ = (ushort)((byte)(uVar16 >> 6) & 1) * auVar20._12_2_;
            auVar21._14_2_ = (ushort)(byte)(uVar16 >> 7) * auVar20._14_2_;
            auVar22 = vpmovsxwd_avx2(auVar21);
            auVar26 = vcvtdq2pd_avx512f(auVar22);
            pfVar4 = pfVar3 + uVar18;
            auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * (int)pfVar4[1];
            auVar22._0_4_ = (uint)(bVar8 & 1) * (int)*pfVar4;
            auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * (int)pfVar4[2];
            auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * (int)pfVar4[3];
            auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * (int)pfVar4[4];
            auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * (int)pfVar4[5];
            auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * (int)pfVar4[6];
            auVar22._28_4_ = (uint)(byte)(uVar16 >> 7) * (int)pfVar4[7];
            auVar27 = vcvtps2pd_avx512f(auVar22);
            auVar26 = vfmadd231pd_avx512f(auVar27,auVar26,auVar25);
            auVar22 = vcvtpd2ps_avx512f(auVar26);
            pfVar4 = pfVar3 + uVar18;
            bVar9 = (bool)((byte)(uVar16 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar16 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar16 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar16 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar16 >> 6) & 1);
            bVar15 = SUB81(uVar16 >> 7,0);
            *pfVar4 = (float)((uint)(bVar8 & 1) * auVar22._0_4_ |
                             (uint)!(bool)(bVar8 & 1) * (int)*pfVar4);
            pfVar4[1] = (float)((uint)bVar9 * auVar22._4_4_ | (uint)!bVar9 * (int)pfVar4[1]);
            pfVar4[2] = (float)((uint)bVar10 * auVar22._8_4_ | (uint)!bVar10 * (int)pfVar4[2]);
            pfVar4[3] = (float)((uint)bVar11 * auVar22._12_4_ | (uint)!bVar11 * (int)pfVar4[3]);
            pfVar4[4] = (float)((uint)bVar12 * auVar22._16_4_ | (uint)!bVar12 * (int)pfVar4[4]);
            pfVar4[5] = (float)((uint)bVar13 * auVar22._20_4_ | (uint)!bVar13 * (int)pfVar4[5]);
            pfVar4[6] = (float)((uint)bVar14 * auVar22._24_4_ | (uint)!bVar14 * (int)pfVar4[6]);
            pfVar4[7] = (float)((uint)bVar15 * auVar22._28_4_ | (uint)!bVar15 * (int)pfVar4[7]);
            uVar18 = uVar18 + 8;
          } while ((iVar1 + 7U & 0xfffffff8) != uVar18);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != (uint)count);
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateScaleFactors(const int* scalingIndices,
                                                int  count,
                                                int  cumulativeScalingIndex) {
    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[0];
        for(int j=0; j<kPatternCount; j++)
            cumulativeScaleBuffer[j] =  0;
        for(int i=0; i<count; i++) {
            int sIndex = scalingIndices[i] - kTipCount;
            if (gActiveScalingFactors[sIndex]) {
                const signed short* scaleBuffer = gAutoScaleBuffers[sIndex];
                for(int j=0; j<kPatternCount; j++) {
                    cumulativeScaleBuffer[j] += M_LN2 * scaleBuffer[j];
                }
            }
        }

    } else {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
        for(int i=0; i<count; i++) {
            const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
            for(int j=0; j<kPatternCount; j++) {
                if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                    cumulativeScaleBuffer[j] += scaleBuffer[j];
                else
                    cumulativeScaleBuffer[j] += log(scaleBuffer[j]);
            }
        }

        if (DEBUGGING_OUTPUT) {
            fprintf(stderr,"Accumulating %d scale buffers into #%d\n",count,cumulativeScalingIndex);
            for(int j=0; j<kPatternCount; j++) {
                fprintf(stderr,"cumulativeScaleBuffer[%d] = %2.5e\n",j,cumulativeScaleBuffer[j]);
            }
        }
    }

    return BEAGLE_SUCCESS;
}